

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O1

error<idx2::idx2_err_code>
idx2::TraverseSecondLevel
          (idx2_file *Idx2,params *P,decode_data *D,decode_state First,extent *Extent,grid *OutGrid,
          mmap_volume *OutVolFile,volume *OutVolMem)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  byte bVar4;
  undefined2 uVar5;
  int iVar6;
  undefined4 uVar7;
  i64 iVar8;
  decode_state Ds;
  bool bVar9;
  ulong uVar10;
  array<idx2::decode_state> *paVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  u64 uVar18;
  ulong uVar19;
  uint uVar20;
  undefined8 uVar21;
  ulong *puVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  char Level;
  byte bVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  long lVar38;
  long *in_FS_OFFSET;
  undefined1 auVar39 [16];
  extent eVar40;
  error<idx2::idx2_err_code> eVar41;
  v3i Brick3;
  chunk_traverse Second_1;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:338:3)>
  __ScopeGuard__338;
  extent Skip;
  extent CurrentExtent;
  extent Skip_1;
  file_traverse Second;
  file_traverse First_1;
  file_traverse FileStack [64];
  uint local_2f24;
  uint local_2f20;
  undefined4 local_2ee8;
  undefined4 uStack_2ee4;
  undefined4 uStack_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 local_2ec8;
  ulong uStack_2ec0;
  ulong uStack_2eb8;
  ulong uStack_2eb0;
  int *local_2ea8;
  int *local_2ea0;
  i64 local_2e98;
  _func_int **local_2e90;
  ulong local_2e88;
  uint local_2e80;
  uint local_2e7c;
  stack_array<idx2::v3<int>,_16> *local_2e78;
  decode_data *local_2e70;
  params *local_2e68;
  undefined8 local_2e60;
  array<idx2::decode_state> local_2e58;
  extent local_2e28;
  extent local_2e18;
  array<idx2::decode_state> *local_2e08;
  char local_2e00;
  extent local_2df8;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 local_2dd8;
  ulong uStack_2dd0;
  ulong uStack_2dc8;
  ulong uStack_2dc0;
  extent local_2db8;
  stack_array<idx2::v3<int>,_16> *local_2da0;
  stack_array<idx2::v3<int>,_16> *local_2d98;
  f64 local_2d90;
  grid *local_2d88;
  mmap_volume *local_2d80;
  extent *local_2d78;
  undefined8 local_2d70;
  undefined8 local_2d68;
  ulong local_2d60;
  extent local_2d58;
  extent local_2d48;
  extent local_2d38;
  extent local_2d28;
  undefined8 local_2d18;
  undefined3 uStack_2d10;
  undefined5 uStack_2d0d;
  undefined3 uStack_2d08;
  undefined8 uStack_2d05;
  extent local_2cf8;
  undefined8 local_2ce8;
  undefined8 uStack_2ce0;
  undefined8 local_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 uStack_2cc0;
  undefined8 local_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  int local_2c98;
  int iStack_2c94;
  int iStack_2c90;
  undefined8 uStack_2c8c;
  undefined8 uStack_2c84;
  byte bStack_2c7c;
  undefined2 uStack_2c7b;
  byte bStack_2c79;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 local_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 uStack_2c40;
  ulong local_2c38 [2];
  undefined8 uStack_2c28;
  undefined8 uStack_2c20;
  undefined8 uStack_2c18;
  ulong uStack_2c10;
  ulong auStack_2c08 [504];
  undefined8 uStack_1c48;
  undefined4 auStack_1c40 [2];
  undefined1 local_1c38 [20];
  bool abStack_1c24 [8];
  bool abStack_1c1c [8];
  bool abStack_1c14 [36];
  bool local_1bf0;
  bool abStack_1be8 [4016];
  unsigned_long local_c38 [2];
  undefined8 uStack_c28;
  int iStack_c20;
  undefined1 auStack_c1c [8];
  int iStack_c14;
  ulong auStack_c10 [380];
  
  auVar39._8_8_ = 0;
  auVar39._0_8_ = P->DecodeTolerance;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = Idx2->Tolerance;
  auVar2 = vmaxsd_avx(auVar39,auVar2);
  local_2d90 = auVar2._0_8_;
  local_2e68 = P;
  local_2d88 = OutGrid;
  local_2d80 = OutVolFile;
  if (Mallocator()::Instance == '\0') {
    TraverseSecondLevel();
  }
  if (Mallocator()::Instance == '\0') {
    TraverseSecondLevel();
  }
  local_2e08 = &local_2e58;
  local_2e58.Buffer.Data = (byte *)0x0;
  local_2e58.Buffer.Bytes = 0;
  local_2e58.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  local_2e58.Size = 0;
  local_2e58.Capacity = 0;
  local_2e58.Alloc = (allocator *)&Mallocator()::Instance;
  local_2e00 = '\0';
  GrowCapacity<idx2::decode_state>(local_2e08,0x80);
  if (local_2e58.Capacity <= local_2e58.Size) {
    GrowCapacity<idx2::decode_state>(&local_2e58,0);
  }
  lVar35 = local_2e58.Size * 0x60;
  uVar21 = First.ParentBrick._56_8_;
  *(undefined1 (*) [32])(local_2e58.Buffer.Data + lVar35 + 0x3e) = First._62_32_;
  pbVar1 = local_2e58.Buffer.Data + lVar35 + 0x20;
  pbVar1[0] = First.ParentBrick.Vol.Type;
  pbVar1[1] = First.ParentBrick.Vol._33_1_;
  pbVar1[2] = First.ParentBrick.Vol._34_1_;
  pbVar1[3] = First.ParentBrick.Vol._35_1_;
  pbVar1[4] = First.ParentBrick.Vol._36_1_;
  pbVar1[5] = First.ParentBrick.Vol._37_1_;
  pbVar1[6] = First.ParentBrick.Vol._38_1_;
  pbVar1[7] = First.ParentBrick.Vol._39_1_;
  *(u64 *)(pbVar1 + 8) = First.ParentBrick.ExtentLocal.From;
  *(u64 *)(pbVar1 + 0x10) = First.ParentBrick.ExtentLocal.Dims;
  *(undefined8 *)(pbVar1 + 0x18) = uVar21;
  pbVar1 = local_2e58.Buffer.Data + lVar35;
  *(byte **)pbVar1 = First.ParentBrick.Vol.Buffer.Data;
  *(i64 *)(pbVar1 + 8) = First.ParentBrick.Vol.Buffer.Bytes;
  *(allocator **)(pbVar1 + 0x10) = First.ParentBrick.Vol.Buffer.Alloc;
  *(u64 *)(pbVar1 + 0x18) = First.ParentBrick.Vol.Dims;
  if (local_2e58.Size < 0) {
    bVar29 = 0;
    local_2e58.Size = local_2e58.Size + 1;
  }
  else {
    local_2d78 = &local_2e68->DecodeExtent;
    local_2e78 = &Idx2->NFiles3;
    local_2d98 = &Idx2->ChunksPerFile3s;
    local_2da0 = &Idx2->BricksPerChunk3s;
    local_2e60 = 0x100000001;
    bVar29 = 0;
    local_2e58.Size = local_2e58.Size + 1;
    local_2e70 = D;
    do {
      local_2e58.Size = local_2e58.Size + -1;
      lVar35 = local_2e58.Size * 0x60;
      pbVar1 = local_2e58.Buffer.Data + lVar35;
      local_2c78 = *(undefined8 *)pbVar1;
      uStack_2c70 = *(undefined8 *)(pbVar1 + 8);
      uStack_2c68 = *(undefined8 *)(pbVar1 + 0x10);
      uStack_2c60 = *(undefined8 *)(pbVar1 + 0x18);
      pbVar1 = local_2e58.Buffer.Data + lVar35 + 0x20;
      local_2c58 = *(undefined8 *)pbVar1;
      uStack_2c50 = *(undefined8 *)(pbVar1 + 8);
      uStack_2c48 = *(undefined8 *)(pbVar1 + 0x10);
      uStack_2c40 = *(undefined8 *)(pbVar1 + 0x18);
      iVar32 = *(int *)(local_2e58.Buffer.Data + lVar35 + 0x40);
      iVar6 = *(int *)(local_2e58.Buffer.Data + lVar35 + 0x44);
      iVar31 = *(int *)(local_2e58.Buffer.Data + lVar35 + 0x48);
      local_2ce8 = *(undefined8 *)(local_2e58.Buffer.Data + lVar35 + 0x4c);
      uStack_2ce0 = *(undefined8 *)(local_2e58.Buffer.Data + lVar35 + 0x4c + 8);
      bVar3 = local_2e58.Buffer.Data[lVar35 + 0x5c];
      iVar34 = (int)(char)bVar3;
      uVar5 = *(undefined2 *)(local_2e58.Buffer.Data + lVar35 + 0x5d);
      bVar4 = local_2e58.Buffer.Data[lVar35 + 0x5f];
      iVar13 = 1;
      uVar21 = local_2e60;
      if ('\0' < (char)bVar3) {
        iVar13 = 1;
        do {
          iVar13 = iVar13 * (Idx2->GroupBrick3).field_0.field_0.Z;
          uVar21 = CONCAT44((int)((ulong)uVar21 >> 0x20) * (Idx2->GroupBrick3).field_0.field_0.Y,
                            (Idx2->GroupBrick3).field_0.field_0.X * (int)uVar21);
          iVar34 = iVar34 + -1;
        } while (iVar34 != 0);
      }
      uVar26 = (Idx2->BrickDims3).field_0.field_0.X * (int)uVar21;
      uVar20 = (int)((ulong)uVar21 >> 0x20) * (Idx2->BrickDims3).field_0.field_0.Y;
      uVar14 = iVar13 * (Idx2->BrickDims3).field_0.field_0.Z;
      local_2e18.From = 0;
      local_2e18.Dims = 0;
      local_2e28.From = 0;
      local_2e28.Dims = 0;
      local_2db8.From = 0;
      local_2db8.Dims = 0;
      local_2d38.From = 0;
      local_2d38.Dims = 0;
      local_2d48.From = 0;
      local_2d48.Dims = 0;
      local_2cf8.From = 0;
      local_2cf8.Dims = 0;
      local_2d58.From =
           (ulong)(uVar14 * iVar31 & 0x1fffff) << 0x2a |
           (ulong)(uVar20 * iVar6 & 0x1fffff) << 0x15 | (ulong)(uVar26 * iVar32 & 0x1fffff);
      local_2d58.Dims =
           (ulong)(uVar14 & 0x1fffff) << 0x2a |
           (ulong)(uVar20 & 0x1fffff) << 0x15 | (ulong)(uVar26 & 0x1fffff);
      eVar40 = Crop<idx2::extent,idx2::extent>(&local_2d58,local_2d78);
      bVar9 = true;
      if ((long)(eVar40.Dims * 2) >> 0x2b != 0 &&
          ((long)(eVar40.Dims << 0x16) >> 0x2b != 0 &&
          ((undefined1  [16])eVar40 & (undefined1  [16])0x1fffff) != (undefined1  [16])0x0)) {
        local_2cd8 = local_2c78;
        uStack_2cd0 = uStack_2c70;
        uStack_2cc8 = uStack_2c68;
        uStack_2cc0 = uStack_2c60;
        local_2cb8 = local_2c58;
        uStack_2cb0 = uStack_2c50;
        uStack_2ca8 = uStack_2c48;
        uStack_2ca0 = uStack_2c40;
        uStack_2c8c = local_2ce8;
        uStack_2c84 = uStack_2ce0;
        Ds.Brick3.field_0.field_0.Y = iVar6;
        Ds.Brick3.field_0.field_0.X = iVar32;
        Ds.Brick3.field_0.field_0.Z = iVar31;
        Ds._76_8_ = local_2ce8;
        Ds._84_8_ = uStack_2ce0;
        Ds.Level = bVar3;
        Ds._93_2_ = uVar5;
        Ds._95_1_ = bVar4;
        Ds.ParentBrick.Vol.Buffer.Bytes = uStack_2c70;
        Ds.ParentBrick.Vol.Buffer.Data = (byte *)local_2c78;
        Ds.ParentBrick.Vol.Buffer.Alloc = (allocator *)uStack_2c68;
        Ds.ParentBrick.Vol.Dims = uStack_2c60;
        Ds.ParentBrick.Vol._32_8_ = local_2c58;
        Ds.ParentBrick.ExtentLocal.From = uStack_2c50;
        Ds.ParentBrick.ExtentLocal.Dims = uStack_2c48;
        Ds.ParentBrick.NChildrenDecoded = (undefined1)uStack_2c40;
        Ds.ParentBrick.NChildrenMax = uStack_2c40._1_1_;
        Ds.ParentBrick.Significant = (bool)uStack_2c40._2_1_;
        Ds.ParentBrick.DoneDecoding = (bool)uStack_2c40._3_1_;
        Ds.ParentBrick._60_4_ = uStack_2c40._4_4_;
        local_2c98 = iVar32;
        iStack_2c94 = iVar6;
        iStack_2c90 = iVar31;
        bStack_2c7c = bVar3;
        uStack_2c7b = uVar5;
        bStack_2c79 = bVar4;
        DecodeTask((expected<idx2::brick_volume,_idx2::idx2_err_code> *)local_1c38,Idx2,local_2e68,
                   local_2e70,Ds,*local_2d88,local_2d90,local_2d80,OutVolMem);
        bVar29 = local_1bf0;
        uVar7 = abStack_1c14._12_4_;
        bVar12 = abStack_1c14[4];
        local_2e90 = (_func_int **)local_1c38._8_8_;
        local_2e98 = stack0xffffffffffffe3d8;
        local_2d68 = CONCAT44(abStack_1c1c._0_4_,abStack_1c24._4_4_);
        local_2d70 = CONCAT44(abStack_1c14._0_4_,abStack_1c1c._4_4_);
        local_2d18 = CONCAT17(abStack_1c14[0xc],abStack_1c14._5_7_);
        uStack_2d05 = CONCAT44(abStack_1c14._28_4_,abStack_1c14._24_4_);
        uStack_2d10._0_1_ = abStack_1c14[0xd];
        uStack_2d10._1_1_ = abStack_1c14[0xe];
        uStack_2d10._2_1_ = abStack_1c14[0xf];
        uStack_2d0d = (undefined5)CONCAT44(abStack_1c14._20_4_,abStack_1c14._16_4_);
        uStack_2d08 = SUB43(abStack_1c14._20_4_,1);
        abStack_1c14._12_4_ = uVar7;
        if ((local_1bf0 & 1U) == 0) {
          bVar9 = false;
        }
        else {
          Level = bVar3 + 0xff;
          uVar14 = CONCAT31((char)bVar3 >> 7,Level);
          if (-1 < Level) {
            if ('\x0f' < Level) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]"
                           );
            }
            uVar15 = (ulong)uVar14 & 0xff;
            if ((Idx2->DecodeSubbandMasks).Arr[uVar15] != '\0') {
              local_2e7c = (uint)Level;
              local_2e80 = uVar14;
              ComputeExtentsForTraversal
                        (Idx2,&local_2d58,Level,&local_2e18,&local_2e28,&local_2db8,&local_2d38,
                         &local_2d48,&local_2cf8);
              lVar35 = 0x28;
              do {
                *(undefined8 *)((long)local_c38 + lVar35) = 0;
                lVar35 = lVar35 + 0x30;
              } while (lVar35 != 0xc28);
              lVar35 = (long)local_2e78->Arr[uVar15].field_0.field_0.X;
              if (lVar35 == 0) {
                uVar17 = 1;
              }
              else {
                uVar16 = lVar35 - 1;
                lVar35 = 0x3f;
                if (uVar16 != 0) {
                  for (; uVar16 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                  }
                }
                uVar17 = 1L << (-((byte)lVar35 ^ 0x3f) & 0x3f) & 0xffffffff;
                if (uVar16 == 0) {
                  uVar17 = 1;
                }
              }
              lVar35 = (long)local_2e78->Arr[uVar15].field_0.field_0.Y;
              uVar16 = 0x100000000;
              if (lVar35 != 0) {
                uVar36 = lVar35 - 1;
                lVar35 = 0x3f;
                if (uVar36 != 0) {
                  for (; uVar36 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                  }
                }
                uVar16 = 0x100000000 << (-((byte)lVar35 ^ 0x3f) & 0x3f);
                if (uVar36 == 0) {
                  uVar16 = 0x100000000;
                }
              }
              lVar35 = (long)local_2e78->Arr[uVar15].field_0.field_0.Z;
              if (lVar35 == 0) {
                iStack_c14 = 1;
              }
              else {
                uVar36 = lVar35 - 1;
                lVar35 = 0x3f;
                if (uVar36 != 0) {
                  for (; uVar36 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                  }
                }
                iStack_c14 = (int)(1L << (-((byte)lVar35 ^ 0x3f) & 0x3f));
                if (uVar36 == 0) {
                  iStack_c14 = 1;
                }
              }
              local_c38[0] = (Idx2->FilesOrder).Arr[uVar15];
              local_c38[1] = local_c38[0];
              uVar36 = 0;
              uStack_c28 = 0;
              iStack_c20 = 0;
              auStack_c1c = (undefined1  [8])(uVar16 | uVar17);
              auStack_c10[0] = 0;
              lVar35 = (ulong)(uint)((int)uVar15 * 4) * 3;
              local_2ea8 = (int *)((long)&local_2d98->Arr[0].field_0 + lVar35);
              local_2ea0 = (int *)((long)&local_2da0->Arr[0].field_0 + lVar35);
              do {
                lVar35 = uVar36 * 0x30;
                puVar22 = local_c38 + uVar36 * 6;
                uVar17 = *puVar22;
                uVar16 = uVar17 >> 2;
                *puVar22 = uVar16;
                uVar14 = (uint)uVar17;
                if ((~uVar14 & 3) == 0) {
                  if (uVar16 == 3) {
                    *puVar22 = local_c38[uVar36 * 6 + 1];
                  }
                  else {
                    local_c38[uVar36 * 6 + 1] = uVar16;
                  }
                }
                else {
                  local_2f24 = (uint)uVar36 - 1;
                  iVar32 = *(int *)(&uStack_c28 + uVar36 * 6);
                  if (((*(int *)(auStack_c1c + lVar35) - iVar32 == 1) &&
                      (iVar6 = *(int *)((long)&uStack_c28 + lVar35 + 4),
                      *(int *)(auStack_c1c + lVar35 + 4) - iVar6 == 1)) &&
                     (iVar31 = (&iStack_c20)[uVar36 * 0xc],
                     *(int *)((long)auStack_c10 + lVar35 + -4) - iVar31 == 1)) {
                    lVar35 = 0x38;
                    do {
                      *(undefined8 *)((long)&uStack_1c48 + lVar35) = 0;
                      *(undefined4 *)((long)auStack_1c40 + lVar35) = 0;
                      *(undefined8 *)(local_1c38 + lVar35) = 0;
                      lVar35 = lVar35 + 0x40;
                    } while (lVar35 != 0x1038);
                    iVar13 = *local_2ea8;
                    iVar34 = 1;
                    iVar33 = 1;
                    if ((long)iVar13 != 0) {
                      uVar17 = (long)iVar13 - 1;
                      lVar35 = 0x3f;
                      if (uVar17 != 0) {
                        for (; uVar17 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                        }
                      }
                      iVar33 = (int)(1L << (-((byte)lVar35 ^ 0x3f) & 0x3f));
                      if (uVar17 == 0) {
                        iVar33 = 1;
                      }
                    }
                    iVar37 = local_2ea8[1];
                    if ((long)iVar37 != 0) {
                      uVar17 = (long)iVar37 - 1;
                      lVar35 = 0x3f;
                      if (uVar17 != 0) {
                        for (; uVar17 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                        }
                      }
                      iVar34 = (int)(1L << (-((byte)lVar35 ^ 0x3f) & 0x3f));
                      if (uVar17 == 0) {
                        iVar34 = 1;
                      }
                    }
                    abStack_1c24._4_4_ = local_2ea8[2];
                    if ((long)(int)abStack_1c24._4_4_ == 0) {
                      iVar27 = 1;
                    }
                    else {
                      uVar17 = (long)(int)abStack_1c24._4_4_ - 1;
                      lVar35 = 0x3f;
                      if (uVar17 != 0) {
                        for (; uVar17 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                        }
                      }
                      iVar27 = (int)(1L << (-((byte)lVar35 ^ 0x3f) & 0x3f));
                      if (uVar17 == 0) {
                        iVar27 = 1;
                      }
                    }
                    local_1c38._0_8_ = (Idx2->ChunksOrderInFile).Arr[uVar15];
                    iVar13 = iVar13 * iVar32;
                    iVar37 = iVar37 * iVar6;
                    abStack_1c24._4_4_ = abStack_1c24._4_4_ * iVar31;
                    local_1c38._8_8_ = local_1c38._0_8_;
                    stack0xffffffffffffe3d8 = CONCAT44(iVar37,iVar13);
                    abStack_1c1c._0_4_ = iVar33 + iVar13;
                    abStack_1c1c._4_4_ = iVar34 + iVar37;
                    abStack_1c14._0_4_ = iVar27 + abStack_1c24._4_4_;
                    uVar17 = 0;
                    abStack_1c14[4] = false;
                    abStack_1c14[5] = false;
                    abStack_1c14[6] = false;
                    abStack_1c14[7] = false;
                    abStack_1c14[8] = false;
                    abStack_1c14[9] = false;
                    abStack_1c14[10] = false;
                    abStack_1c14[0xb] = false;
                    abStack_1c14[0xc] = false;
                    abStack_1c14[0xd] = false;
                    abStack_1c14[0xe] = false;
                    abStack_1c14[0xf] = false;
                    abStack_1c14[0x14] = false;
                    abStack_1c14[0x15] = false;
                    abStack_1c14[0x16] = false;
                    abStack_1c14[0x17] = false;
                    abStack_1c14[0x18] = false;
                    abStack_1c14[0x19] = false;
                    abStack_1c14[0x1a] = false;
                    abStack_1c14[0x1b] = false;
                    do {
                      lVar35 = uVar17 * 0x40;
                      puVar22 = (ulong *)(local_1c38 + uVar17 * 0x40);
                      uVar16 = *puVar22;
                      uVar36 = uVar16 >> 2;
                      *puVar22 = uVar36;
                      uVar14 = (uint)uVar16;
                      if ((~uVar14 & 3) == 0) {
                        if (uVar36 == 3) {
                          *puVar22 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -9) * 8);
                        }
                        else {
                          *(ulong *)(abStack_1be8 + (uVar17 * 8 + -9) * 8) = uVar36;
                        }
                      }
                      else {
                        local_2f20 = (int)uVar17 - 1;
                        iVar32 = *(int *)(abStack_1be8 + (uVar17 * 8 + -8) * 8);
                        if (((*(int *)(abStack_1be8 + uVar17 * 0x40 + -0x34) - iVar32 == 1) &&
                            (iVar6 = *(int *)(abStack_1be8 + lVar35 + -0x3c),
                            *(int *)(abStack_1be8 + (uVar17 * 8 + -6) * 8) - iVar6 == 1)) &&
                           (iVar31 = *(int *)(abStack_1be8 + (uVar17 * 8 + -7) * 8),
                           *(int *)(abStack_1be8 + uVar17 * 0x40 + -0x2c) - iVar31 == 1)) {
                          lVar35 = 0x38;
                          do {
                            *(undefined8 *)((long)&uStack_2c48 + lVar35) = 0;
                            *(undefined4 *)((long)&uStack_2c40 + lVar35) = 0;
                            *(undefined8 *)((long)local_2c38 + lVar35) = 0;
                            lVar35 = lVar35 + 0x40;
                          } while (lVar35 != 0x1038);
                          iVar13 = *local_2ea0;
                          iVar34 = 1;
                          iVar33 = 1;
                          if ((long)iVar13 != 0) {
                            uVar17 = (long)iVar13 - 1;
                            lVar35 = 0x3f;
                            if (uVar17 != 0) {
                              for (; uVar17 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                              }
                            }
                            iVar33 = (int)(1L << (-((byte)lVar35 ^ 0x3f) & 0x3f));
                            if (uVar17 == 0) {
                              iVar33 = 1;
                            }
                          }
                          iVar37 = local_2ea0[1];
                          if ((long)iVar37 != 0) {
                            uVar17 = (long)iVar37 - 1;
                            lVar35 = 0x3f;
                            if (uVar17 != 0) {
                              for (; uVar17 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                              }
                            }
                            iVar34 = (int)(1L << (-((byte)lVar35 ^ 0x3f) & 0x3f));
                            if (uVar17 == 0) {
                              iVar34 = 1;
                            }
                          }
                          iVar27 = local_2ea0[2];
                          if ((long)iVar27 == 0) {
                            iVar28 = 1;
                          }
                          else {
                            uVar17 = (long)iVar27 - 1;
                            lVar35 = 0x3f;
                            if (uVar17 != 0) {
                              for (; uVar17 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                              }
                            }
                            iVar28 = (int)(1L << (-((byte)lVar35 ^ 0x3f) & 0x3f));
                            if (uVar17 == 0) {
                              iVar28 = 1;
                            }
                          }
                          local_2c38[0] = (Idx2->BricksOrderInChunk).Arr[uVar15];
                          uVar14 = iVar13 * iVar32;
                          uVar16 = (ulong)uVar14;
                          iVar37 = iVar37 * iVar6;
                          uStack_2c20._0_4_ = iVar27 * iVar31;
                          local_2c38[1] = local_2c38[0];
                          uStack_2c28 = CONCAT44(iVar37,uVar14);
                          uStack_2c20._4_4_ = iVar33 + uVar14;
                          uStack_2c18._0_4_ = iVar34 + iVar37;
                          uStack_2c18._4_4_ = iVar28 + (uint)uStack_2c20;
                          uVar17 = 0;
                          uStack_2c10 = 0;
                          auStack_2c08[0] = auStack_2c08[0] & 0xffffffff00000000;
                          auStack_2c08[1] = 0;
                          do {
                            uVar20 = (uint)uVar17;
                            lVar35 = uVar17 * 0x40;
                            puVar22 = local_2c38 + uVar17 * 8;
                            uVar36 = *puVar22;
                            uVar23 = uVar36 >> 2;
                            *puVar22 = uVar23;
                            uVar14 = (uint)uVar36;
                            if ((~uVar14 & 3) == 0) {
                              if (uVar23 == 3) {
                                *puVar22 = local_2c38[uVar17 * 8 + 1];
                              }
                              else {
                                local_2c38[uVar17 * 8 + 1] = uVar23;
                              }
                            }
                            else {
                              uVar20 = uVar20 - 1;
                              if (((*(int *)((long)&uStack_2c20 + (uVar17 * 0x10 + 1) * 4) -
                                    *(int *)(&uStack_2c28 + uVar17 * 8) == 1) &&
                                  (*(int *)(&uStack_2c18 + uVar17 * 8) -
                                   *(int *)((long)&uStack_2c28 + lVar35 + 4) == 1)) &&
                                 (*(int *)((long)&uStack_2c18 + uVar17 * 0x40 + 4) -
                                  *(int *)(&uStack_2c20 + uVar17 * 8) == 1)) {
                                if (Mallocator()::Instance == '\0') {
                                  TraverseSecondLevel();
                                }
                                uVar36 = auStack_2c08[uVar17 * 8];
                                uVar7 = *(undefined4 *)(&uStack_2c20 + uVar17 * 8);
                                uStack_2ee4 = (undefined4)(&uStack_2c28)[uVar17 * 8];
                                uStack_2ee0 = (undefined4)
                                              ((ulong)(&uStack_2c28)[uVar17 * 8] >> 0x20);
                                Brick3.field_0.field_0.Y = 0;
                                Brick3.field_0.field_0.X = *(uint *)(&uStack_2c20 + uVar17 * 8);
                                Brick3.field_0._8_4_ = (undefined4)uVar16;
                                uVar16 = uVar16 & 0xffffffff;
                                uVar18 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)local_2e7c,
                                                        (int)(&uStack_2c28)[uVar17 * 8],Brick3);
                                if (local_2e58.Capacity <= local_2e58.Size) {
                                  GrowCapacity<idx2::decode_state>(&local_2e58,0);
                                }
                                lVar35 = local_2e58.Size * 0x60;
                                *(_func_int ***)(local_2e58.Buffer.Data + lVar35) = local_2e90;
                                *(i64 *)(local_2e58.Buffer.Data + lVar35 + 8) = local_2e98;
                                *(undefined8 *)(local_2e58.Buffer.Data + lVar35 + 0x10) = local_2d68
                                ;
                                *(undefined8 *)(local_2e58.Buffer.Data + lVar35 + 0x18) = local_2d70
                                ;
                                local_2e58.Buffer.Data[lVar35 + 0x20] = bVar12;
                                *(undefined8 *)(local_2e58.Buffer.Data + lVar35 + 0x21) = local_2d18
                                ;
                                *(ulong *)(local_2e58.Buffer.Data + lVar35 + 0x21 + 8) =
                                     CONCAT53(uStack_2d0d,uStack_2d10);
                                *(ulong *)(local_2e58.Buffer.Data + lVar35 + 0x2c) =
                                     CONCAT35(uStack_2d08,uStack_2d0d);
                                *(undefined8 *)(local_2e58.Buffer.Data + lVar35 + 0x2c + 8) =
                                     uStack_2d05;
                                *(ulong *)(local_2e58.Buffer.Data + lVar35 + 0x3c) =
                                     CONCAT44(uStack_2ee4,local_2ee8);
                                *(ulong *)(local_2e58.Buffer.Data + lVar35 + 0x3c + 8) =
                                     CONCAT44(uVar7,uStack_2ee0);
                                *(u64 *)(local_2e58.Buffer.Data + lVar35 + 0x50) = uVar18;
                                *(int *)(local_2e58.Buffer.Data + lVar35 + 0x58) = (int)uVar36;
                                local_2e58.Buffer.Data[lVar35 + 0x5c] = (byte)local_2e80;
                                local_2e58.Size = local_2e58.Size + 1;
                              }
                              else {
                                local_2d60 = uVar17;
                                uVar36 = *puVar22;
                                uVar23 = local_2c38[uVar17 * 8 + 1];
                                uVar16 = (&uStack_2c28)[uVar17 * 8];
                                uVar25 = (&uStack_2c20)[uVar17 * 8];
                                local_2ec8 = (&uStack_2c18)[uVar17 * 8];
                                uStack_2ec0 = (&uStack_2c10)[uVar17 * 8];
                                uStack_2eb8 = auStack_2c08[uVar17 * 8];
                                uStack_2eb0 = auStack_2c08[uVar17 * 8 + 1];
                                local_2ee8 = (undefined4)uVar36;
                                local_2dd8 = (&uStack_2c18)[uVar17 * 8];
                                uStack_2dd0 = (&uStack_2c10)[uVar17 * 8];
                                uStack_2dc8 = auStack_2c08[uVar17 * 8];
                                uStack_2dc0 = auStack_2c08[uVar17 * 8 + 1];
                                local_2df8.From = *puVar22;
                                local_2df8.Dims = local_2c38[uVar17 * 8 + 1];
                                uStack_2de8 = (&uStack_2c28)[uVar17 * 8];
                                uStack_2de0 = (&uStack_2c20)[uVar17 * 8];
                                uVar19 = (ulong)((uVar14 & 3) << 2);
                                iVar32 = *(int *)((long)&uStack_2c28 + uVar19 + lVar35);
                                iVar32 = (*(int *)((long)&uStack_2c20 + uVar19 + lVar35 + 4) -
                                         iVar32) / 2 + iVar32;
                                *(int *)((long)&uStack_2ed0 + uVar19 + 4) = iVar32;
                                uVar10 = uStack_2ec0;
                                *(int *)((long)&uStack_2de8 + uVar19) = iVar32;
                                uStack_2ed0._4_4_ = (int)(uVar25 >> 0x20);
                                uStack_2ed8._0_4_ = (int)uVar16;
                                iVar31 = (int)uStack_2ed8;
                                uStack_2ed8._4_4_ = (uint)(uVar16 >> 0x20);
                                local_2e88 = CONCAT44(local_2e88._4_4_,uStack_2ed0._4_4_);
                                uVar14 = uStack_2ed0._4_4_ - (int)uStack_2ed8;
                                lVar30 = (long)(int)local_2ec8;
                                lVar35 = (long)(int)uStack_2ed8._4_4_;
                                lVar38 = (long)local_2ec8._4_4_;
                                uStack_2ed0._0_4_ = (uint)uVar25;
                                lVar24 = (long)(int)(uint)uStack_2ed0;
                                local_2d28.From =
                                     (ulong)((uint)uStack_2ed0 & 0x1fffff) << 0x2a |
                                     ((ulong)uStack_2ed8._4_4_ & 0x1fffff) << 0x15 |
                                     uVar16 & 0x1fffff;
                                local_2d28.Dims =
                                     (ulong)((uint)(lVar38 - lVar24) & 0x1fffff) << 0x2a |
                                     (ulong)((uint)(lVar30 - lVar35) & 0x1fffff) << 0x15 |
                                     (ulong)(uVar14 & 0x1fffff);
                                uStack_2ed8 = uVar16;
                                uStack_2ed0 = uVar25;
                                eVar40 = Crop<idx2::extent,idx2::extent>(&local_2d28,&local_2e18);
                                uVar18 = eVar40.Dims;
                                uStack_2dd0 = ((long)(uVar18 << 0x16) >> 0x2b) *
                                              ((long)(uVar18 << 0x2b) >> 0x2b) *
                                              ((long)(uVar18 * 2) >> 0x2b) + uVar10;
                                iVar32 = (int)uStack_2eb8;
                                eVar40 = Crop<idx2::extent,idx2::extent>(&local_2d28,&local_2d38);
                                uStack_2dc8 = CONCAT44(uStack_2dc8._4_4_,
                                                       (((int)eVar40.Dims << 0xb) >> 0xb) *
                                                       (int)((long)(eVar40.Dims * 2) >> 0x2b) *
                                                       (int)((long)(eVar40.Dims << 0x16) >> 0x2b) +
                                                       iVar32);
                                uStack_2eb0 = auStack_2c08[uVar17 * 8 + 1];
                                uStack_2dc0 = (lVar30 - lVar35) * (long)(int)uVar14 *
                                              (lVar38 - lVar24) + uStack_2eb0;
                                uVar25 = (long)(local_2e18.From << 0x16) >> 0xb;
                                lVar35 = (long)(local_2e18.Dims << 0x16) >> 0xb;
                                iVar32 = (int)((long)(local_2e18.Dims << 0x2b) >> 0x2b);
                                iVar6 = (int)((long)(local_2e18.From << 0x2b) >> 0x2b);
                                iVar13 = (int)((long)(local_2e18.From * 2) >> 0x2b);
                                iVar33 = (int)((long)(local_2e18.Dims * 2) >> 0x2b) + iVar13;
                                iVar34 = (int)((long)(local_2e18.From << 0x16) >> 0x2b);
                                if ((((int)uStack_2de8 < iVar32 + iVar6) &&
                                    (uStack_2de8._4_4_ <
                                     (int)((uVar25 & 0xffffffff00000000) + lVar35 >> 0x20))) &&
                                   (((int)uStack_2de0 < iVar33 &&
                                    (((iVar6 < uStack_2de0._4_4_ && (iVar34 < (int)local_2dd8)) &&
                                     (iVar13 < local_2dd8._4_4_)))))) {
                                  (&uStack_2c18)[uVar17 * 8] = local_2dd8;
                                  (&uStack_2c10)[uVar17 * 8] = uStack_2dd0;
                                  auStack_2c08[uVar17 * 8] = uStack_2dc8;
                                  auStack_2c08[uVar17 * 8 + 1] = uStack_2dc0;
                                  *puVar22 = local_2df8.From;
                                  local_2c38[uVar17 * 8 + 1] = local_2df8.Dims;
                                  (&uStack_2c28)[uVar17 * 8] = uStack_2de8;
                                  (&uStack_2c20)[uVar17 * 8] = uStack_2de0;
                                  uVar20 = (uint)local_2d60;
                                }
                                uVar14 = iVar32 + iVar6;
                                uVar16 = (ulong)uVar14;
                                if (iVar31 < (int)uVar14) {
                                  uVar16 = uVar25 & 0xffffffff00000000;
                                  if ((((int)uStack_2ed8._4_4_ < (int)(lVar35 + uVar16 >> 0x20)) &&
                                      ((int)(uint)uStack_2ed0 < iVar33)) &&
                                     ((iVar6 < (int)local_2e88 &&
                                      ((iVar34 < (int)local_2ec8 && (iVar13 < local_2ec8._4_4_))))))
                                  {
                                    lVar35 = (long)(int)uVar20;
                                    uVar20 = uVar20 + 1;
                                    auStack_2c08[lVar35 * 8 + 6] = local_2ec8;
                                    auStack_2c08[lVar35 * 8 + 7] = uStack_2ec0;
                                    auStack_2c08[lVar35 * 8 + 8] = uStack_2eb8;
                                    auStack_2c08[lVar35 * 8 + 9] = uStack_2eb0;
                                    auStack_2c08[lVar35 * 8 + 2] = uVar36;
                                    auStack_2c08[lVar35 * 8 + 3] = uVar23;
                                    auStack_2c08[lVar35 * 8 + 4] = uStack_2ed8;
                                    auStack_2c08[lVar35 * 8 + 5] = uStack_2ed0;
                                  }
                                }
                              }
                            }
                            uVar17 = (ulong)uVar20;
                          } while (-1 < (int)uVar20);
                          uVar17 = (ulong)local_2f20;
                        }
                        else {
                          uStack_2c18._0_4_ =
                               (int)*(undefined8 *)(abStack_1be8 + (uVar17 * 8 + -6) * 8);
                          uStack_2c18._4_4_ =
                               (int)((ulong)*(undefined8 *)(abStack_1be8 + (uVar17 * 8 + -6) * 8) >>
                                    0x20);
                          uStack_2c10 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -5) * 8);
                          auStack_2c08[0] = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -4) * 8);
                          auStack_2c08[1] = *(undefined8 *)(abStack_1be8 + (uVar17 * 8 + -3) * 8);
                          local_2c38[0] = *puVar22;
                          local_2c38[1] = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -9) * 8);
                          uStack_2c28 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -8) * 8);
                          uStack_2c20._0_4_ =
                               (uint)*(undefined8 *)(abStack_1be8 + (uVar17 * 8 + -7) * 8);
                          uStack_2c20._4_4_ =
                               (int)((ulong)*(undefined8 *)(abStack_1be8 + (uVar17 * 8 + -7) * 8) >>
                                    0x20);
                          uVar16 = *puVar22;
                          uVar21 = *(undefined8 *)(abStack_1be8 + (uVar17 * 8 + -9) * 8);
                          uStack_2ed8 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -8) * 8);
                          uStack_2ed0 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -7) * 8);
                          local_2ec8 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -6) * 8);
                          uStack_2ec0 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -5) * 8);
                          uStack_2eb8 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -4) * 8);
                          uStack_2eb0 = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -3) * 8);
                          local_2ee8 = (undefined4)uVar16;
                          uVar36 = (ulong)((uVar14 & 3) << 2);
                          iVar32 = (*(int *)(abStack_1be8 + uVar36 + lVar35 + -0x34) -
                                   *(int *)(abStack_1be8 + uVar36 + lVar35 + -0x40)) / 2 +
                                   *(int *)(abStack_1be8 + uVar36 + lVar35 + -0x40);
                          *(int *)((long)&uStack_2c20 + uVar36 + 4) = iVar32;
                          local_2e88 = uVar17;
                          *(int *)((long)&uStack_2ed8 + uVar36) = iVar32;
                          uVar36 = uStack_2c10;
                          iVar13 = uStack_2c20._4_4_;
                          iVar31 = (int)uStack_2c28;
                          uVar14 = uStack_2c20._4_4_ - (int)uStack_2c28;
                          lVar30 = (long)(int)uStack_2c18;
                          lVar35 = (long)(int)uStack_2c28._4_4_;
                          lVar38 = (long)uStack_2c18._4_4_;
                          lVar24 = (long)(int)(uint)uStack_2c20;
                          local_2df8.From =
                               (ulong)((uint)uStack_2c20 & 0x1fffff) << 0x2a |
                               ((ulong)uStack_2c28._4_4_ & 0x1fffff) << 0x15 |
                               uStack_2c28 & 0x1fffff;
                          local_2df8.Dims =
                               (ulong)((uint)(lVar38 - lVar24) & 0x1fffff) << 0x2a |
                               (ulong)((uint)(lVar30 - lVar35) & 0x1fffff) << 0x15 |
                               (ulong)(uVar14 & 0x1fffff);
                          eVar40 = Crop<idx2::extent,idx2::extent>(&local_2df8,&local_2e28);
                          uVar18 = eVar40.Dims;
                          uStack_2ec0 = ((long)(uVar18 << 0x16) >> 0x2b) *
                                        ((long)(uVar18 << 0x2b) >> 0x2b) *
                                        ((long)(uVar18 * 2) >> 0x2b) + uVar36;
                          iVar32 = (int)auStack_2c08[0];
                          eVar40 = Crop<idx2::extent,idx2::extent>(&local_2df8,&local_2d48);
                          uStack_2eb8 = CONCAT44(uStack_2eb8._4_4_,
                                                 (((int)eVar40.Dims << 0xb) >> 0xb) *
                                                 (int)((long)(eVar40.Dims * 2) >> 0x2b) *
                                                 (int)((long)(eVar40.Dims << 0x16) >> 0x2b) + iVar32
                                                );
                          auStack_2c08[1] = *(ulong *)(abStack_1be8 + (uVar17 * 8 + -3) * 8);
                          uStack_2eb0 = (lVar30 - lVar35) * (long)(int)uVar14 * (lVar38 - lVar24) +
                                        auStack_2c08[1];
                          uVar36 = (long)(local_2e28.From << 0x16) >> 0xb;
                          lVar35 = (long)(local_2e28.Dims << 0x16) >> 0xb;
                          iVar32 = (int)((long)(local_2e28.Dims << 0x2b) >> 0x2b);
                          iVar6 = (int)((long)(local_2e28.From << 0x2b) >> 0x2b);
                          iVar34 = (int)((long)(local_2e28.From * 2) >> 0x2b);
                          iVar37 = (int)((long)(local_2e28.Dims * 2) >> 0x2b) + iVar34;
                          iVar33 = (int)((long)(local_2e28.From << 0x16) >> 0x2b);
                          if (((((int)uStack_2ed8 < iVar32 + iVar6) &&
                               ((int)uStack_2ed8._4_4_ <
                                (int)((uVar36 & 0xffffffff00000000) + lVar35 >> 0x20))) &&
                              ((int)(uint)uStack_2ed0 < iVar37)) &&
                             (((iVar6 < uStack_2ed0._4_4_ && (iVar33 < (int)local_2ec8)) &&
                              (iVar34 < local_2ec8._4_4_)))) {
                            *(ulong *)(abStack_1be8 + (uVar17 * 8 + -6) * 8) = local_2ec8;
                            *(ulong *)(abStack_1be8 + (uVar17 * 8 + -5) * 8) = uStack_2ec0;
                            *(ulong *)(abStack_1be8 + (uVar17 * 8 + -4) * 8) = uStack_2eb8;
                            *(ulong *)(abStack_1be8 + (uVar17 * 8 + -3) * 8) = uStack_2eb0;
                            *puVar22 = uVar16;
                            *(undefined8 *)(abStack_1be8 + (uVar17 * 8 + -9) * 8) = uVar21;
                            *(ulong *)(abStack_1be8 + (uVar17 * 8 + -8) * 8) = uStack_2ed8;
                            *(ulong *)(abStack_1be8 + (uVar17 * 8 + -7) * 8) = uStack_2ed0;
                            local_2f20 = (uint)local_2e88;
                          }
                          if (((iVar31 < iVar32 + iVar6) &&
                              ((int)uStack_2c28._4_4_ <
                               (int)(lVar35 + (uVar36 & 0xffffffff00000000) >> 0x20))) &&
                             (((int)(uint)uStack_2c20 < iVar37 &&
                              (((iVar6 < iVar13 && (iVar33 < (int)uStack_2c18)) &&
                               (iVar34 < uStack_2c18._4_4_)))))) {
                            lVar35 = (long)(int)local_2f20;
                            local_2f20 = local_2f20 + 1;
                            *(ulong *)(abStack_1be8 + (lVar35 * 8 + 2) * 8) =
                                 CONCAT44(uStack_2c18._4_4_,(int)uStack_2c18);
                            *(ulong *)(abStack_1be8 + (lVar35 * 8 + 3) * 8) = uStack_2c10;
                            *(ulong *)(abStack_1be8 + (lVar35 * 8 + 4) * 8) = auStack_2c08[0];
                            *(ulong *)(abStack_1be8 + (lVar35 * 8 + 5) * 8) = auStack_2c08[1];
                            *(ulong *)(abStack_1be8 + (lVar35 * 8 + -2) * 8) = local_2c38[0];
                            *(ulong *)(abStack_1be8 + (lVar35 * 8 + -1) * 8) = local_2c38[1];
                            *(ulong *)(abStack_1be8 + lVar35 * 0x40) = uStack_2c28;
                            *(ulong *)(abStack_1be8 + (lVar35 * 8 + 1) * 8) =
                                 CONCAT44(uStack_2c20._4_4_,(uint)uStack_2c20);
                          }
                          uVar17 = (ulong)local_2f20;
                        }
                      }
                    } while (-1 < (int)uVar17);
                    uVar36 = (ulong)local_2f24;
                  }
                  else {
                    iVar8 = (&uStack_c28)[uVar36 * 6];
                    abStack_1c1c._4_4_ = (undefined4)*(undefined8 *)(auStack_c1c + lVar35 + 4);
                    abStack_1c14._0_4_ =
                         (undefined4)((ulong)*(undefined8 *)(auStack_c1c + lVar35 + 4) >> 0x20);
                    abStack_1c14[4] = SUB81(auStack_c10[uVar36 * 6],0);
                    abStack_1c14._5_7_ = (undefined7)(auStack_c10[uVar36 * 6] >> 8);
                    local_1c38._0_8_ = (mutex_type *)*puVar22;
                    local_1c38._8_8_ = (_func_int **)local_c38[uVar36 * 6 + 1];
                    stack0xffffffffffffe3d8 = iVar8;
                    uVar21 = stack0xffffffffffffe3d8;
                    abStack_1c24._4_4_ = (undefined4)*(undefined8 *)(&iStack_c20 + uVar36 * 0xc);
                    abStack_1c1c._0_4_ =
                         (undefined4)((ulong)*(undefined8 *)(&iStack_c20 + uVar36 * 0xc) >> 0x20);
                    local_2c38[0] = *puVar22;
                    local_2c38[1] = local_c38[uVar36 * 6 + 1];
                    uStack_2c18._0_4_ = (int)*(undefined8 *)(auStack_c1c + lVar35 + 4);
                    uStack_2c18._4_4_ =
                         (int)((ulong)*(undefined8 *)(auStack_c1c + lVar35 + 4) >> 0x20);
                    uStack_2c10 = auStack_c10[uVar36 * 6];
                    uStack_2c28 = (&uStack_c28)[uVar36 * 6];
                    uStack_2c20._0_4_ = (uint)*(undefined8 *)(&iStack_c20 + uVar36 * 0xc);
                    uStack_2c20._4_4_ =
                         (int)((ulong)*(undefined8 *)(&iStack_c20 + uVar36 * 0xc) >> 0x20);
                    uVar17 = (ulong)((uVar14 & 3) << 2);
                    iVar32 = *(int *)((long)&uStack_c28 + uVar17 + lVar35);
                    iVar32 = (*(int *)(auStack_c1c + uVar17 + lVar35) - iVar32) / 2 + iVar32;
                    *(int *)(abStack_1be8 + (uVar17 - 0x34)) = iVar32;
                    *(int *)((long)&uStack_2c28 + uVar17) = iVar32;
                    local_1c38._16_4_ = (undefined4)iVar8;
                    abStack_1c24._0_4_ = (undefined4)((ulong)iVar8 >> 0x20);
                    uVar17 = auStack_c10[uVar36 * 6];
                    abStack_1c14[4] = SUB81(uVar17,0);
                    abStack_1c14._5_7_ = (undefined7)(uVar17 >> 8);
                    uStack_2c10 = (long)(int)(abStack_1c1c._0_4_ - local_1c38._16_4_) *
                                  ((long)(int)abStack_1c14._0_4_ - (long)(int)abStack_1c24._4_4_) *
                                  ((long)(int)abStack_1c1c._4_4_ - (long)(int)abStack_1c24._0_4_) +
                                  uVar17;
                    uVar16 = (long)(local_2db8.From << 0x16) >> 0xb;
                    lVar24 = (long)(local_2db8.Dims << 0x16) >> 0xb;
                    iVar32 = (int)((long)(local_2db8.Dims << 0x2b) >> 0x2b);
                    iVar6 = (int)((long)(local_2db8.From << 0x2b) >> 0x2b);
                    iVar31 = (int)((long)(local_2db8.From * 2) >> 0x2b);
                    iVar34 = (int)((long)(local_2db8.Dims * 2) >> 0x2b) + iVar31;
                    iVar13 = (int)((long)(local_2db8.From << 0x16) >> 0x2b);
                    if (((((int)uStack_2c28 < iVar32 + iVar6) &&
                         ((int)uStack_2c28._4_4_ <
                          (int)((uVar16 & 0xffffffff00000000) + lVar24 >> 0x20))) &&
                        (((int)(uint)uStack_2c20 < iVar34 &&
                         ((iVar6 < uStack_2c20._4_4_ && (iVar13 < (int)uStack_2c18)))))) &&
                       (iVar31 < uStack_2c18._4_4_)) {
                      (&uStack_c28)[uVar36 * 6] = uStack_2c28;
                      *(ulong *)(&iStack_c20 + uVar36 * 0xc) =
                           CONCAT44(uStack_2c20._4_4_,(uint)uStack_2c20);
                      *(ulong *)(auStack_c1c + lVar35 + 4) =
                           CONCAT44(uStack_2c18._4_4_,(int)uStack_2c18);
                      auStack_c10[uVar36 * 6] = uStack_2c10;
                      *puVar22 = local_2c38[0];
                      local_c38[uVar36 * 6 + 1] = local_2c38[1];
                      (&uStack_c28)[uVar36 * 6] = uStack_2c28;
                      *(ulong *)(&iStack_c20 + uVar36 * 0xc) =
                           CONCAT44(uStack_2c20._4_4_,(uint)uStack_2c20);
                      local_2f24 = (uint)uVar36;
                    }
                    if ((((((int)local_1c38._16_4_ < iVar32 + iVar6) &&
                          ((int)abStack_1c24._0_4_ <
                           (int)(lVar24 + (uVar16 & 0xffffffff00000000) >> 0x20))) &&
                         ((int)abStack_1c24._4_4_ < iVar34)) &&
                        ((iVar6 < (int)abStack_1c1c._0_4_ && (iVar13 < (int)abStack_1c1c._4_4_))))
                       && (iVar31 < (int)abStack_1c14._0_4_)) {
                      local_2f24 = local_2f24 + 1;
                      lVar35 = (long)(int)local_2f24;
                      (&uStack_c28)[lVar35 * 6] = iVar8;
                      *(ulong *)(&iStack_c20 + lVar35 * 0xc) =
                           CONCAT44(abStack_1c1c._0_4_,abStack_1c24._4_4_);
                      *(ulong *)(auStack_c1c + lVar35 * 0x30 + 4) =
                           CONCAT44(abStack_1c14._0_4_,abStack_1c1c._4_4_);
                      auStack_c10[lVar35 * 6] = uVar17;
                      local_c38[lVar35 * 6] = local_1c38._0_8_;
                      local_c38[lVar35 * 6 + 1] = local_1c38._8_8_;
                      (&uStack_c28)[lVar35 * 6] = iVar8;
                      *(ulong *)(&iStack_c20 + lVar35 * 0xc) =
                           CONCAT44(abStack_1c1c._0_4_,abStack_1c24._4_4_);
                    }
                    uVar36 = (ulong)local_2f24;
                    unique0x10004f9d = uVar21;
                  }
                }
              } while (-1 < (int)uVar36);
            }
          }
        }
      }
      D = local_2e70;
    } while ((bVar9) && (0 < local_2e58.Size));
  }
  local_1c38._0_8_ = &D->Mutex;
  local_1c38._8_8_ = local_1c38._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1c38);
  local_1c38[8] = 1;
  D->NTasks = D->NTasks + -1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1c38);
  if (D->NTasks == 0) {
    std::condition_variable::notify_all();
  }
  paVar11 = local_2e08;
  if ((bVar29 & 1) != 0) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x19d;
    local_2e90 = (_func_int **)0x1bd71d;
    local_2e98 = 0;
  }
  if (local_2e00 == '\0') {
    (*local_2e08->Alloc->_vptr_allocator[1])(local_2e08->Alloc,local_2e08);
    paVar11->Size = 0;
    paVar11->Capacity = 0;
  }
  eVar41.Code = (undefined1)local_2e98;
  eVar41.StackIdx = local_2e98._1_1_;
  eVar41.StrGened = (bool)local_2e98._2_1_;
  eVar41._11_5_ = local_2e98._3_5_;
  eVar41.Msg = (cstr)local_2e90;
  return eVar41;
}

Assistant:

error<idx2_err_code>
TraverseSecondLevel(const idx2_file& Idx2,
                    const params& P,
                    decode_data* D,
                    decode_state First,
                    const extent& Extent,
                    const grid& OutGrid,
                    mmap_volume* OutVolFile,
                    volume* OutVolMem)
{
  // then decode the subtree
  f64 Tolerance = Max(Idx2.Tolerance, P.DecodeTolerance);
  int LastIndex = 0;
  idx2_RAII(array<decode_state>, BrickStack, Reserve(&BrickStack, 128), Dealloc(&BrickStack));
  PushBack(&BrickStack, First);
  expected<brick_volume, idx2_err_code> Result;
  while (Size(BrickStack) > 0)
  {
    decode_state Current = Back(BrickStack);
    //printf("level %d current " idx2_PrStrV3i "\n", Current.Level, idx2_PrV3i(Current.Brick3));
    PopBack(&BrickStack);
    i8 NextLevel = Current.Level - 1;
    // TODO: check for error
    v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Current.Level);
    extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
    extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
    extent CurrentExtent = extent(Current.Brick3 * B3, B3);
    extent CurrentExtentCrop = Crop(CurrentExtent, P.DecodeExtent);
    //printf("  extent     " idx2_PrStrExt "\n", idx2_PrExt(CurrentExtent));
    //printf("  extent crop" idx2_PrStrExt "\n", idx2_PrExt(CurrentExtentCrop));
    if (Prod<i64>(Dims(CurrentExtentCrop)) == 0)
      continue;
    Result = DecodeTask(Idx2, P, D, Current, OutGrid, Tolerance, OutVolFile, OutVolMem);
    if (!Result)
      goto EXIT;

    if (NextLevel < 0 || Idx2.DecodeSubbandMasks[NextLevel] == 0)
      continue;

    ComputeExtentsForTraversal(Idx2,
                               CurrentExtent,
                               NextLevel,
                               &ExtentInBricks,
                               &ExtentInChunks,
                               &ExtentInFiles,
                               &VolExtentInBricks,
                               &VolExtentInChunks,
                               &VolExtentInFiles);
    idx2_FileTraverse(
      idx2_ChunkTraverse(
        idx2_BrickTraverse(
          decode_state Ds;
          Ds.BrickInChunk = Top.BrickInChunk;
          Ds.Level = NextLevel;
          Ds.Brick3 = Top.BrickFrom3;
          Ds.Brick = GetLinearBrick(Idx2, NextLevel, Top.BrickFrom3);
          Ds.ParentBrick = Value(Result);
          PushBack(&BrickStack, Ds);
          ,
          64,
          Idx2.BricksOrderInChunk[NextLevel],
          ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[NextLevel],
          Idx2.BricksPerChunk3s[NextLevel],
          ExtentInBricks,
          VolExtentInBricks);
        ,
        64,
        Idx2.ChunksOrderInFile[NextLevel],
        FileTop.FileFrom3 * Idx2.ChunksPerFile3s[NextLevel],
        Idx2.ChunksPerFile3s[NextLevel],
        ExtentInChunks,
        VolExtentInChunks);
      , 64, Idx2.FilesOrder[NextLevel], v3i(0), Idx2.NFiles3[NextLevel], ExtentInFiles, VolExtentInFiles);


  }

  EXIT:
  {
    std::unique_lock<std::mutex> Lock(D->Mutex);
    --D->NTasks;
  }
  if (D->NTasks == 0)
    D->AllTasksDone.notify_all();

  if (!Result)
    return Error(Result);

  return idx2_Error(idx2_err_code::NoError);
}


error<idx2_err_code>
TraverseFirstLevel(const idx2_file& Idx2,
                   const params& P,
                   decode_data* D,
                   const grid& OutGrid,
                   mmap_volume* OutVolFile,
                   volume* OutVolMem)
{
  i8 Level = Idx2.NLevels - 1; // coarsest level
  extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
  extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
  ComputeExtentsForTraversal(Idx2,
                             P.DecodeExtent,
                             Level,
                             &ExtentInBricks,
                             &ExtentInChunks,
                             &ExtentInFiles,
                             &VolExtentInBricks,
                             &VolExtentInChunks,
                             &VolExtentInFiles);
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level); // dimension of bricks on this level
  decode_state Ds;
  idx2_FileTraverse(
    idx2_ChunkTraverse(
      idx2_BrickTraverse(
        extent BrickExtent = extent(Top.BrickFrom3 * B3, B3);
        extent BrickExtentCrop = Crop(BrickExtent, P.DecodeExtent);
        {
          std::unique_lock<std::mutex> Lock(D->Mutex);
          ++D->NTasks;
        }
        decode_state First;
        First.BrickInChunk = Top.BrickInChunk;
        First.Level = Level;
        First.Brick3 = Top.BrickFrom3;
        First.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
        D->ThreadPool.push_task([&, First, BrickExtentCrop]() {
          TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        });
        //auto Task = stlab::async(stlab::default_executor,
        //  [&, First, BrickExtentCrop]()
        //  {
        //    TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        //  });
        //Task.detach();
        ,
        64,
        Idx2.BricksOrderInChunk[Level],
        ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
        Idx2.BricksPerChunk3s[Level],
        ExtentInBricks,
        VolExtentInBricks);
      ,
      64,
      Idx2.ChunksOrderInFile[Level],
      FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
      Idx2.ChunksPerFile3s[Level],
      ExtentInChunks,
      VolExtentInChunks);
    , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);

  return idx2_Error(idx2_err_code::NoError);
}


/* TODO: dealloc chunks after we are done with them */
error<idx2_err_code>
ParallelDecode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  // printf("output grid = " idx2_PrStrGrid "\n", idx2_PrGrid(OutGrid));
  mmap_volume OutVolFile;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVolFile); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile
                     ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                     : idx2_PrintScratch(
                         "%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVolFile, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // for now the allocator seems not a bottleneck
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator()));

  TraverseFirstLevel(Idx2, P, &D, OutGrid, &OutVolFile, &OutVolMem);

  std::unique_lock<std::mutex> Lock(D.Mutex);
  D.AllTasksDone.wait(Lock, [&D]{ return D.NTasks == 0; });
  //stlab::pre_exit();

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}


}